

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpsocketengine.cpp
# Opt level: O0

bool __thiscall
QHttpSocketEngine::leaveMulticastGroup
          (QHttpSocketEngine *this,QHostAddress *param_2,QNetworkInterface *param_3)

{
  QLatin1StringView latin1;
  qsizetype in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  uint in_stack_ffffffffffffff78;
  QString *errorString;
  SocketError error;
  QMessageLogger *in_stack_ffffffffffffff90;
  QString *this_00;
  char *pcVar1;
  QString local_40;
  QString local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  errorString = &local_28;
  pcVar1 = in_RDI;
  QMessageLogger::QMessageLogger
            (in_stack_ffffffffffffff90,in_RDI,(int)((ulong)errorString >> 0x20),
             (char *)(ulong)in_stack_ffffffffffffff78);
  QMessageLogger::warning((char *)errorString,"Operation is not supported");
  Qt::Literals::StringLiterals::operator____L1(in_RDI,(size_t)errorString);
  error = (SocketError)((ulong)in_RDI >> 0x20);
  this_00 = &local_40;
  latin1.m_data = pcVar1;
  latin1.m_size = in_RSI;
  QString::QString(this_00,latin1);
  QAbstractSocketEngine::setError((QAbstractSocketEngine *)this_00,error,errorString);
  QString::~QString((QString *)0x339df6);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return false;
  }
  __stack_chk_fail();
}

Assistant:

bool QHttpSocketEngine::leaveMulticastGroup(const QHostAddress &,
                                            const QNetworkInterface &)
{
    qWarning("Operation is not supported");
    setError(QAbstractSocket::UnsupportedSocketOperationError, "Unsupported socket operation"_L1);
    return false;
}